

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<pstore::exchange::import_ns::callbacks>::
multi_line_comment_body
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char c)

{
  uint *puVar1;
  
  if ((parser->extensions_ & multi_line_comments) == none) {
    assert_failed("parser.extension_enabled (extensions::multi_line_comments)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x605);
  }
  if ((this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ == 6) {
    if (c == '\n') {
      (parser->coordinate_).column = 0;
      puVar1 = &(parser->coordinate_).row;
      *puVar1 = *puVar1 + 1;
    }
    else if (c == '\r') {
      cr(this,parser,multi_line_comment_crlf_state);
    }
    else if (c == '*') {
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 7;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
    ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
    __return_storage_ptr__->second = true;
    return __return_storage_ptr__;
  }
  assert_failed("this->get_state () == multi_line_comment_body_state",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x606);
}

Assistant:

constexpr bool extension_enabled (extensions const flag) const noexcept {
                using ut = std::underlying_type_t<extensions>;
                return (static_cast<ut> (extensions_) & static_cast<ut> (flag)) != 0U;
            }